

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O2

graphProperties *
floorplan::GraphFileOperations::loadGraphFromXML
          (graphProperties *__return_storage_ptr__,string *filenamePath,floorplanGraph *outGraph,
          string *rootNodeName)

{
  long *plVar1;
  double *pdVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  pointer pLVar5;
  pointer pLVar6;
  boost *this;
  double dVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  self_type *psVar11;
  vertex_descriptor pvVar12;
  mapped_type *ppvVar13;
  size_type sVar14;
  ulong uVar15;
  pointer pLVar16;
  pointer pPVar17;
  int i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar18;
  ulong uVar19;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
  *in_R8;
  StoredVertex *sv;
  pair<bool,_void_*> pVar20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_670;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_668;
  undefined8 *local_660;
  char *endptr;
  allocator<char> local_64a;
  allocator<char> local_649;
  pointer local_648;
  graphProperties *local_640;
  floorplanGraph *local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_628;
  string *local_620;
  vector<Point2D,_std::allocator<Point2D>_> points;
  string spaceName;
  LineSegment lsegment;
  Point2D local_570;
  string spaceType;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  nameToVertex;
  string local_510;
  string local_4f0;
  ptree XMLtree;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  
  local_638 = outGraph;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree(&XMLtree);
  std::locale::locale((locale *)&lsegment);
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filenamePath,&XMLtree,0,(locale *)&lsegment);
  std::locale::~locale((locale *)&lsegment);
  nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header;
  nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nameToVertex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       nameToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  graphProperties::graphProperties(__return_storage_ptr__);
  local_640 = __return_storage_ptr__;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->filepath);
  lVar10 = std::__cxx11::string::rfind((char)filenamePath,0x2f);
  if (lVar10 == -1) {
    std::__cxx11::string::_M_assign((string *)local_640);
  }
  else {
    std::__cxx11::string::substr((ulong)&lsegment,(ulong)filenamePath);
    std::__cxx11::string::operator=((string *)local_640,(string *)&lsegment);
    std::__cxx11::string::~string((string *)&lsegment);
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lsegment,(rootNodeName->_M_dataplus)._M_p,0x2e);
  psVar11 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&XMLtree,(path_type *)&lsegment);
  std::__cxx11::string::~string((string *)&lsegment);
  local_630 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                **)((long)psVar11->m_children + 8);
  pcVar3 = local_630[1].second.m_data._M_dataplus._M_p;
  local_670 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(pcVar3 + -0x60);
  if (pcVar3 == (pointer)0x0) {
    local_670 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0;
  }
  bVar8 = true;
  while ((bVar8 && (local_670 != local_630))) {
    bVar8 = false;
    while (!bVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lsegment,(local_670->first)._M_dataplus._M_p,
                 (allocator<char> *)&spaceName);
      iVar9 = std::__cxx11::string::compare((char *)&lsegment);
      std::__cxx11::string::~string((string *)&lsegment);
      bVar8 = true;
      if (iVar9 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_108,local_670);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"name",(allocator<char> *)&lsegment);
        GetAttr(&spaceName,&local_108,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair(&local_108);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_150,local_670);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"type",(allocator<char> *)&lsegment);
        GetAttr(&spaceType,&local_150,&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair(&local_150);
        lVar10 = std::__cxx11::string::find((char)&spaceName,0x2e);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)&lsegment,(ulong)&spaceName);
          std::__cxx11::string::operator=((string *)&spaceName,(string *)&lsegment);
          std::__cxx11::string::~string((string *)&lsegment);
        }
        if (spaceName._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_3a8,(string *)&spaceName);
          pVar20 = GraphUtils::doesVertexExists(&local_3a8,local_638);
          pvVar12 = pVar20.second;
          std::__cxx11::string::~string((string *)&local_3a8);
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pvVar12 = boost::
                      add_vertex<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                                (&local_638->super_type);
            std::__cxx11::string::_M_assign((string *)((long)pvVar12 + 0x18));
            std::__cxx11::string::_M_assign((string *)((long)pvVar12 + 0x38));
            ppvVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                       ::operator[](&nameToVertex,&spaceName);
            *ppvVar13 = pvVar12;
          }
          puVar4 = *(undefined8 **)((long)(local_670->second).m_children + 8);
          lVar10 = puVar4[0xd];
          local_660 = (undefined8 *)(lVar10 + -0x60);
          if (lVar10 == 0) {
            local_660 = (undefined8 *)0x0;
          }
          local_648 = (pointer)((long)pvVar12 + 0x58);
          bVar8 = true;
          while ((bVar8 && (local_660 != puVar4))) {
            bVar8 = false;
            while (!bVar8) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&lsegment,(char *)*local_660,(allocator<char> *)&local_4f0);
              iVar9 = std::__cxx11::string::compare((char *)&lsegment);
              std::__cxx11::string::~string((string *)&lsegment);
              bVar8 = true;
              if (iVar9 == 0) {
                points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ppVar18 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            **)(local_660[8] + 8);
                bVar8 = true;
                local_628 = ppVar18;
                while( true ) {
                  pcVar3 = ppVar18[1].second.m_data._M_dataplus._M_p;
                  ppVar18 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(pcVar3 + -0x60);
                  if (pcVar3 == (pointer)0x0) {
                    ppVar18 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)0x0;
                  }
                  if ((!bVar8) || (ppVar18 == local_628)) break;
                  bVar8 = false;
                  while (!bVar8) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&lsegment,(ppVar18->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_4f0);
                    iVar9 = std::__cxx11::string::compare((char *)&lsegment);
                    std::__cxx11::string::~string((string *)&lsegment);
                    if (iVar9 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_78,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3c8,"x",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_78,&local_3c8);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x90) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_3c8);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_78);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_198,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3e8,"y",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_198,&local_3e8);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x98) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_3e8);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_198);
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&lsegment,(ppVar18->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_4f0);
                    iVar9 = std::__cxx11::string::compare((char *)&lsegment);
                    std::__cxx11::string::~string((string *)&lsegment);
                    if (iVar9 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_c0,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_408,"maxx",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_c0,&local_408);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x70) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_408);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_c0);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_1e0,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_428,"maxy",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_1e0,&local_428);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x78) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_428);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_1e0);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_228,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_448,"minx",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_228,&local_448);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x80) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_448);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_228);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_270,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_468,"miny",(allocator<char> *)&local_4f0);
                      GetAttr((string *)&lsegment,&local_270,&local_468);
                      dVar7 = strtod((char *)lsegment.startPos.x,&endptr);
                      *(double *)((long)pvVar12 + 0x88) = dVar7;
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_468);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_270);
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&lsegment,(ppVar18->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_4f0);
                    iVar9 = std::__cxx11::string::compare((char *)&lsegment);
                    std::__cxx11::string::~string((string *)&lsegment);
                    if (iVar9 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_300,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_488,"x",&local_649);
                      GetAttr((string *)&lsegment,&local_300,&local_488);
                      local_620 = (string *)strtod((char *)lsegment.startPos.x,&endptr);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_348,ppVar18);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_4a8,"y",&local_64a);
                      GetAttr(&local_4f0,&local_348,&local_4a8);
                      local_570.y = strtod(local_4f0._M_dataplus._M_p,&endptr);
                      local_570.x = (double)local_620;
                      std::vector<Point2D,_std::allocator<Point2D>_>::emplace_back<Point2D>
                                (&points,&local_570);
                      std::__cxx11::string::~string((string *)&local_4f0);
                      std::__cxx11::string::~string((string *)&local_4a8);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_348);
                      std::__cxx11::string::~string((string *)&lsegment);
                      std::__cxx11::string::~string((string *)&local_488);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~pair(&local_300);
                    }
                    bVar8 = true;
                  }
                }
                if (points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  LineSegment::LineSegment(&lsegment);
                  lVar10 = 0x10;
                  for (uVar19 = 0;
                      uVar15 = (long)points.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)points.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 4, uVar19 < uVar15;
                      uVar19 = uVar19 + 1) {
                    pdVar2 = (double *)
                             ((long)&points.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                     _M_impl.super__Vector_impl_data._M_start[-1].x + lVar10);
                    lsegment.startPos.x = *pdVar2;
                    lsegment.startPos.y = pdVar2[1];
                    pPVar17 = (pointer)((long)&(points.
                                                super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->x +
                                       lVar10);
                    if (uVar19 == uVar15 - 1) {
                      pPVar17 = points.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl
                                .super__Vector_impl_data._M_start;
                    }
                    lsegment.endPos.x = pPVar17->x;
                    lsegment.endPos.y = pPVar17->y;
                    std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back
                              ((vector<LineSegment,_std::allocator<LineSegment>_> *)local_648,
                               &lsegment);
                    lVar10 = lVar10 + 0x10;
                  }
                  LineSegment::~LineSegment(&lsegment);
                }
                std::_Vector_base<Point2D,_std::allocator<Point2D>_>::~_Vector_base
                          (&points.super__Vector_base<Point2D,_std::allocator<Point2D>_>);
                bVar8 = true;
              }
            }
            plVar1 = local_660 + 0xd;
            local_660 = (undefined8 *)(*plVar1 + -0x60);
            if (*plVar1 == 0) {
              local_660 = (undefined8 *)0x0;
            }
          }
        }
        std::__cxx11::string::~string((string *)&spaceType);
        std::__cxx11::string::~string((string *)&spaceName);
        bVar8 = true;
      }
    }
    pcVar3 = local_670[1].second.m_data._M_dataplus._M_p;
    local_670 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar3 + -0x60);
    if (pcVar3 == (pointer)0x0) {
      local_670 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
    }
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&lsegment,(rootNodeName->_M_dataplus)._M_p,0x2e);
  psVar11 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&XMLtree,(path_type *)&lsegment);
  std::__cxx11::string::~string((string *)&lsegment);
  local_630 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                **)((long)psVar11->m_children + 8);
  pcVar3 = local_630[1].second.m_data._M_dataplus._M_p;
  local_668 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(pcVar3 + -0x60);
  if (pcVar3 == (pointer)0x0) {
    local_668 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0;
  }
  bVar8 = true;
  while ((bVar8 && (local_668 != local_630))) {
    bVar8 = false;
    while( true ) {
      if (bVar8) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lsegment,(local_668->first)._M_dataplus._M_p,
                 (allocator<char> *)&spaceName);
      iVar9 = std::__cxx11::string::compare((char *)&lsegment);
      std::__cxx11::string::~string((string *)&lsegment);
      bVar8 = true;
      if (iVar9 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_2b8,local_668);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_510,"name",(allocator<char> *)&lsegment);
        GetAttr(&spaceName,&local_2b8,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair(&local_2b8);
        lVar10 = std::__cxx11::string::find((char)&spaceName,0x2e);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)&lsegment,(ulong)&spaceName);
          std::__cxx11::string::operator=((string *)&spaceName,(string *)&lsegment);
          std::__cxx11::string::~string((string *)&lsegment);
        }
        pLVar5 = *(pointer *)((long)(local_668->second).m_children + 8);
        bVar8 = true;
        local_648 = pLVar5;
        while( true ) {
          pLVar6 = (((_Vector_base<LineSegment,_std::allocator<LineSegment>_> *)
                    &local_648[1].startPos)->_M_impl).super__Vector_impl_data._M_finish;
          pLVar16 = pLVar6 + -1;
          if (pLVar6 == (pointer)0x0) {
            pLVar16 = (pointer)0x0;
          }
          if ((!bVar8) || (pLVar16 == pLVar5)) break;
          bVar8 = false;
          local_648 = pLVar16;
          while (!bVar8) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&lsegment,(char *)(local_648->startPos).x,
                       (allocator<char> *)&spaceType);
            iVar9 = std::__cxx11::string::compare((char *)&lsegment);
            std::__cxx11::string::~string((string *)&lsegment);
            bVar8 = true;
            if (iVar9 == 0) {
              boost::property_tree::
              string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&lsegment,"<xmlattr>",0x2e);
              psVar11 = boost::property_tree::
                        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::get_child((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&pLVar16->type,(path_type *)&lsegment);
              std::__cxx11::string::~string((string *)&lsegment);
              ppVar18 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          **)((long)psVar11->m_children + 8);
              bVar8 = true;
              local_628 = ppVar18;
              while( true ) {
                pcVar3 = ppVar18[1].second.m_data._M_dataplus._M_p;
                ppVar18 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(pcVar3 + -0x60);
                if (pcVar3 == (pointer)0x0) {
                  ppVar18 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)0x0;
                }
                if ((!bVar8) || (ppVar18 == local_628)) break;
                local_620 = (string *)&ppVar18->second;
                bVar8 = false;
                while (!bVar8) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&lsegment,(ppVar18->first)._M_dataplus._M_p,
                             (allocator<char> *)&spaceType);
                  iVar9 = std::__cxx11::string::compare((char *)&lsegment);
                  std::__cxx11::string::~string((string *)&lsegment);
                  bVar8 = true;
                  if (iVar9 == 0) {
                    std::__cxx11::string::string((string *)&lsegment,local_620);
                    lVar10 = std::__cxx11::string::find((char)&lsegment,0x2e);
                    if (lVar10 != -1) {
                      std::__cxx11::string::substr((ulong)&spaceType,(ulong)&lsegment);
                      std::__cxx11::string::operator=((string *)&lsegment,(string *)&spaceType);
                      std::__cxx11::string::~string((string *)&spaceType);
                    }
                    sVar14 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                             ::count(&nameToVertex,(key_type *)&lsegment);
                    if ((sVar14 != 0) &&
                       (sVar14 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::count(&nameToVertex,&spaceName), sVar14 != 0)) {
                      ppvVar13 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[](&nameToVertex,&spaceName);
                      this = (boost *)*ppvVar13;
                      ppvVar13 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[](&nameToVertex,(key_type *)&lsegment);
                      pvVar12 = *ppvVar13;
                      boost::
                      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                                ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>
                                  *)&spaceType,this,pvVar12,local_638,in_R8);
                      if ((spaceType.field_2._M_local_buf[8] == '\0') &&
                         (iVar9 = std::__cxx11::string::compare((string *)&lsegment), iVar9 != 0)) {
                        boost::
                        add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                                  ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>
                                    *)&local_4f0,this,pvVar12,local_638,
                                   (undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
                                    *)in_R8);
                      }
                    }
                    std::__cxx11::string::~string((string *)&lsegment);
                  }
                }
              }
              bVar8 = true;
            }
          }
        }
        std::__cxx11::string::~string((string *)&spaceName);
        bVar8 = true;
      }
    }
    pcVar3 = local_668[1].second.m_data._M_dataplus._M_p;
    local_668 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar3 + -0x60);
    if (pcVar3 == (pointer)0x0) {
      local_668 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::~_Rb_tree(&nameToVertex._M_t);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&XMLtree);
  return local_640;
}

Assistant:

static graphProperties loadGraphFromXML(std::string filenamePath, floorplanGraph& outGraph, std::string rootNodeName){
        ptree XMLtree;
        read_xml(filenamePath, XMLtree);
        map<string, Vertex> nameToVertex;
        graphProperties currentGraphProperty;
        currentGraphProperty.filepath = filenamePath;

        size_t foundDot = filenamePath.find_last_of('/');
        if (foundDot != string::npos)
            currentGraphProperty.floorname = filenamePath.substr(foundDot+1, filenamePath.size()-1);
        else
            currentGraphProperty.floorname = filenamePath;

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string spaceName = GetAttr(v, "name");
                string spaceType = GetAttr(v, "type");

                size_t foundDot = spaceName.find_first_of('.');
                if (foundDot != string::npos)
                    spaceName = spaceName.substr(0, foundDot);


                if (!spaceName.empty()){
                    pair<bool,Vertex> searchResult =  GraphUtils::doesVertexExists(spaceName, outGraph);
                    Vertex currentVertex;
                    if (!searchResult.first){
                        currentVertex = add_vertex(outGraph);
                        outGraph[currentVertex].category  =  spaceType ;
                        outGraph[currentVertex].vertex_id =  spaceName;
                        nameToVertex[spaceName] = currentVertex;
                    }
                    else {

                        currentVertex = searchResult.second;
                    }
                    // For each space's children
                    BOOST_FOREACH(ptree::value_type &i,
                                  v.second)
                    {
                        if (((string)i.first.data()).compare("contour") == 0){
                            vector<Point2D> points;
                            BOOST_FOREACH(ptree::value_type &l,
                                          i.second)
                            {

                                char* endptr;
                                if( ((string)l.first.data()).compare("centroid") == 0 ){
                                    outGraph[currentVertex].centroid.x = strtod(GetAttr(l, "x").c_str(), &endptr);
                                    outGraph[currentVertex].centroid.y = strtod(GetAttr(l, "y").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("extent") == 0 ){

                                    outGraph[currentVertex].maxx = strtod(GetAttr(l, "maxx").c_str(), &endptr);
                                    outGraph[currentVertex].maxy = strtod(GetAttr(l, "maxy").c_str(), &endptr);
                                    outGraph[currentVertex].minx = strtod(GetAttr(l, "minx").c_str(), &endptr);
                                    outGraph[currentVertex].miny = strtod(GetAttr(l, "miny").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("point") == 0 ){
                                    points.push_back(Point2D(strtod(GetAttr(l, "x").c_str(), &endptr), strtod(GetAttr(l, "y").c_str(), &endptr)));
                                }
                            } // for each contour children

                            if(points.size() > 0){
                                LineSegment lsegment;
                                for (int i=0; i < points.size(); i++){
                                    if(i == points.size()-1){
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[0];
                                    }
                                    else{
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[i+1];
                                    }
                                    outGraph[currentVertex].roomLayout.push_back(lsegment);
                                }
                            }

                        } // if it's a contour

                    } // for each space children
                } // if space with an non-empty name
            } // if space
        }


        // now add edges

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string sourceSpaceName = GetAttr(v, "name");
                size_t foundDot = sourceSpaceName.find_first_of('.');
                if (foundDot != string::npos)
                    sourceSpaceName = sourceSpaceName.substr(0, foundDot);
                BOOST_FOREACH(ptree::value_type &i,
                              v.second)
                {
                    if( ((string)i.first.data()).compare("portal") == 0 )
                    {

                        BOOST_FOREACH(ptree::value_type &j,
                                      i.second.get_child("<xmlattr>"))
                        {
                            if( ((string)j.first.data()).compare("target") == 0 )
                            {
                                string targetSpaceName = (string)j.second.data();
                                size_t foundDot = targetSpaceName.find_first_of('.');
                                if (foundDot != string::npos)
                                    targetSpaceName = targetSpaceName.substr(0, foundDot);

                                if (nameToVertex.count(targetSpaceName) != 0 && nameToVertex.count(sourceSpaceName) !=  0) {
                                    Vertex v1 = nameToVertex[sourceSpaceName];
                                    Vertex v2 = nameToVertex[targetSpaceName];
                                    pair<Edge, bool> ret = boost::edge(v1, v2, outGraph);
                                    if (!ret.second && targetSpaceName.compare(sourceSpaceName) != 0){
                                        add_edge(v1, v2, outGraph);
                                    } // if edge does not already exists and target,source are not the same
                                } // if both target and source exists in the graph
                            } // if it's a target attribute
                        } // for each portal's attributes
                    } // if this is a portal

                } // for each element of space
            } // if this is a space
        } // Adding edges end

        return currentGraphProperty;
    }